

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.c
# Opt level: O1

rtree_leaf_elm_t * rtree_leaf_init(tsdn_t *tsdn,rtree_t *rtree,atomic_p_t *elmp)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int iVar3;
  base_t *base;
  rtree_leaf_elm_t *prVar4;
  mutex_prof_data_t *data;
  
  __mutex = (pthread_mutex_t *)((long)&(rtree->init_lock).field_0 + 0x40);
  iVar3 = pthread_mutex_trylock(__mutex);
  if (iVar3 != 0) {
    malloc_mutex_lock_slow(&rtree->init_lock);
    (rtree->init_lock).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(rtree->init_lock).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((rtree->init_lock).field_0.field_0.prof_data.prev_owner != tsdn) {
    (rtree->init_lock).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(rtree->init_lock).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  prVar4 = (rtree_leaf_elm_t *)elmp->repr;
  if (prVar4 == (rtree_leaf_elm_t *)0x0) {
    base = b0get();
    prVar4 = (rtree_leaf_elm_t *)base_alloc(tsdn,base,0x200000,0x40);
    if (prVar4 == (rtree_leaf_elm_t *)0x0) {
      prVar4 = (rtree_leaf_elm_t *)0x0;
    }
    else {
      elmp->repr = prVar4;
    }
  }
  (rtree->init_lock).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return prVar4;
}

Assistant:

static rtree_leaf_elm_t *
rtree_leaf_init(tsdn_t *tsdn, rtree_t *rtree, atomic_p_t *elmp) {
	malloc_mutex_lock(tsdn, &rtree->init_lock);
	/*
	 * If *elmp is non-null, then it was initialized with the init lock
	 * held, so we can get by with 'relaxed' here.
	 */
	rtree_leaf_elm_t *leaf = atomic_load_p(elmp, ATOMIC_RELAXED);
	if (leaf == NULL) {
		leaf = rtree_leaf_alloc(tsdn, rtree, ZU(1) <<
		    rtree_levels[RTREE_HEIGHT-1].bits);
		if (leaf == NULL) {
			malloc_mutex_unlock(tsdn, &rtree->init_lock);
			return NULL;
		}
		/*
		 * Even though we hold the lock, a later reader might not; we
		 * need release semantics.
		 */
		atomic_store_p(elmp, leaf, ATOMIC_RELEASE);
	}
	malloc_mutex_unlock(tsdn, &rtree->init_lock);

	return leaf;
}